

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_image_write_to_stdio
              (png_imagep image,FILE *file,int convert_to_8bit,void *buffer,png_int_32 row_stride,
              void *colormap)

{
  int iVar1;
  png_imagep paStack_98;
  int result;
  png_image_write_control display;
  void *colormap_local;
  png_int_32 row_stride_local;
  void *buffer_local;
  int convert_to_8bit_local;
  FILE *file_local;
  png_imagep image_local;
  
  display.output_bytes = (png_alloc_size_t)colormap;
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image == (png_imagep)0x0) {
      image_local._4_4_ = 0;
    }
    else {
      image_local._4_4_ =
           png_image_error(image,"png_image_write_to_stdio: incorrect PNG_IMAGE_VERSION");
    }
  }
  else if ((file == (FILE *)0x0) || (buffer == (void *)0x0)) {
    image_local._4_4_ = png_image_error(image,"png_image_write_to_stdio: invalid argument");
  }
  else {
    iVar1 = png_image_write_init(image);
    if (iVar1 == 0) {
      image_local._4_4_ = 0;
    }
    else {
      image->opaque->png_ptr->io_ptr = file;
      memset(&stack0xffffffffffffff68,0,0x58);
      display._16_8_ = display.output_bytes;
      paStack_98 = image;
      display.image = (png_imagep)buffer;
      display.buffer._0_4_ = row_stride;
      display.colormap._0_4_ = convert_to_8bit;
      image_local._4_4_ = png_safe_execute(image,png_image_write_main,&stack0xffffffffffffff68);
      png_image_free(image);
    }
  }
  return image_local._4_4_;
}

Assistant:

int PNGAPI
png_image_write_to_stdio(png_imagep image, FILE *file, int convert_to_8bit,
    const void *buffer, png_int_32 row_stride, const void *colormap)
{
   /* Write the image to the given FILE object. */
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file != NULL && buffer != NULL)
      {
         if (png_image_write_init(image) != 0)
         {
            png_image_write_control display;
            int result;

            /* This is slightly evil, but png_init_io doesn't do anything other
             * than this and we haven't changed the standard IO functions so
             * this saves a 'safe' function.
             */
            image->opaque->png_ptr->io_ptr = file;

            memset(&display, 0, (sizeof display));
            display.image = image;
            display.buffer = buffer;
            display.row_stride = row_stride;
            display.colormap = colormap;
            display.convert_to_8bit = convert_to_8bit;

            result = png_safe_execute(image, png_image_write_main, &display);
            png_image_free(image);
            return result;
         }

         else
            return 0;
      }

      else
         return png_image_error(image,
             "png_image_write_to_stdio: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_write_to_stdio: incorrect PNG_IMAGE_VERSION");

   else
      return 0;
}